

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall
Privkey_GenerageRandomKeyTest_Test::TestBody(Privkey_GenerageRandomKeyTest_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_88;
  AssertHelper local_68;
  Message local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_;
  bool local_31;
  undefined1 local_30 [7];
  bool is_valid;
  Privkey privkey;
  Privkey_GenerageRandomKeyTest_Test *this_local;
  
  privkey._24_8_ = this;
  cfd::core::Privkey::GenerageRandomKey();
  local_31 = cfd::core::Privkey::IsValid((Privkey *)local_30);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_58,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(internal *)local_58,(AssertionResult *)0x690dd7,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0xf2,message);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(Privkey, GenerageRandomKeyTest) {
  Privkey privkey = Privkey::GenerageRandomKey();
  bool is_valid = privkey.IsValid();
  EXPECT_TRUE(is_valid);
}